

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

void __thiscall QToolBarAreaLayout::apply(QToolBarAreaLayout *this,bool animate)

{
  Representation RVar1;
  QToolBarAreaLayoutItem *pQVar2;
  long *plVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  QRect QVar6;
  QRect QVar7;
  bool bVar8;
  char cVar9;
  byte bVar10;
  LayoutDirection direction;
  int iVar11;
  Representation RVar12;
  QMainWindowLayout *pQVar13;
  QWidget *widget;
  QWidget *this_00;
  QToolBarLayout *this_01;
  QSize QVar14;
  ulong uVar15;
  long lVar16;
  Representation RVar17;
  QToolBarAreaLayoutLine *pQVar18;
  Representation RVar19;
  Representation *pRVar20;
  QToolBarAreaLayoutLine *this_02;
  ulong uVar21;
  Representation RVar22;
  long lVar23;
  long in_FS_OFFSET;
  QSize local_50;
  undefined1 local_48 [8];
  Representation RStack_40;
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar13 = qt_mainwindow_layout(this->mainWindow);
  direction = QWidget::layoutDirection(&this->mainWindow->super_QWidget);
  lVar16 = 0;
  do {
    if (this->docks[lVar16].lines.d.size != 0) {
      uVar15 = 0;
      do {
        this_02 = this->docks[lVar16].lines.d.ptr + uVar15;
        bVar8 = QToolBarAreaLayoutLine::skip(this_02);
        if ((!bVar8) && ((this_02->toolBarItems).d.size != 0)) {
          lVar23 = 0x14;
          uVar21 = 0;
          do {
            pQVar2 = (this_02->toolBarItems).d.ptr;
            bVar10 = *(byte *)((long)&pQVar2->widgetItem + lVar23);
            if (bVar10 == 0) {
              plVar3 = *(long **)((long)pQVar2 + lVar23 + -0x14);
              if ((plVar3 != (long *)0x0) &&
                 (cVar9 = (**(code **)(*plVar3 + 0x40))(), cVar9 == '\0')) {
                bVar10 = *(byte *)((long)&pQVar2->widgetItem + lVar23);
                goto LAB_004b143a;
              }
            }
            else {
LAB_004b143a:
              if ((bVar10 & 1) == 0) {
                _local_48 = ZEXT412(0xffffffff) << 0x40;
                RStack_3c.m_i = -1;
                if (this->visible == true) {
                  if (this_02->o == Horizontal) {
                    auVar4._4_4_ = RStack_40.m_i;
                    auVar4._8_4_ = RStack_3c.m_i;
                    auVar4._0_4_ = (this_02->rect).y1.m_i;
                    _local_48 = auVar4 << 0x20;
                    RStack_3c.m_i = (this_02->rect).y2.m_i;
                    iVar11 = *(int *)((long)pQVar2 + lVar23 + -0xc);
                    local_48._0_4_ = (this_02->rect).x1.m_i + iVar11;
                    pRVar20 = &RStack_40;
                    pQVar18 = this_02;
                  }
                  else {
                    RVar1.m_i = (this_02->rect).x1.m_i;
                    local_48._0_4_ = RVar1.m_i;
                    RStack_40.m_i = (this_02->rect).x2.m_i;
                    RStack_3c.m_i = -1;
                    iVar11 = *(int *)((long)pQVar2 + lVar23 + -0xc);
                    local_48._4_4_ = (this_02->rect).y1.m_i + iVar11;
                    pRVar20 = &RStack_3c;
                    pQVar18 = (QToolBarAreaLayoutLine *)&(this_02->rect).y1;
                  }
                  pRVar20->m_i = iVar11 + (pQVar18->rect).x1.m_i +
                                 *(int *)((long)pQVar2 + lVar23 + -8) + -1;
                }
                widget = (QWidget *)
                         (**(code **)(**(long **)((long)pQVar2 + lVar23 + -0x14) + 0x68))();
                this_00 = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
                if (this_00 != (QWidget *)0x0) {
                  QWidget::layout(this_00);
                  this_01 = (QToolBarLayout *)
                            QMetaObject::cast((QObject *)&QToolBarLayout::staticMetaObject);
                  if ((this_01->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
                    RVar19.m_i = RStack_40.m_i;
                    RVar22.m_i = local_48._4_4_;
                    local_50.wd.m_i = (RStack_40.m_i - local_48._0_4_) + 1;
                    local_50.ht.m_i = (RStack_3c.m_i - local_48._4_4_) + 1;
                    QVar14 = QToolBarLayout::expandedSize(this_01,&local_50);
                    RVar12.m_i = (RVar19.m_i - QVar14.wd.m_i) + 1;
                    local_48._0_4_ = RVar12.m_i;
                    _local_48 = CONCAT48(RVar19.m_i,local_48);
                    RVar17.m_i = QVar14.ht.m_i.m_i + -1 + RVar22.m_i;
                    RStack_3c.m_i = RVar17.m_i;
                    local_48 = (undefined1  [8])CONCAT44(RVar22.m_i,local_48._0_4_);
                    RVar1.m_i = (this->rect).y2.m_i;
                    if (RVar1.m_i < RVar17.m_i) {
                      RVar22.m_i = (RVar1.m_i - QVar14.ht.m_i) + 1;
                      local_48._4_4_ = RVar22.m_i;
                      RStack_3c.m_i = RVar1.m_i;
                      RVar17.m_i = RVar1.m_i;
                    }
                    QVar6 = _local_48;
                    iVar11 = (this->rect).x2.m_i;
                    if (iVar11 < RVar19.m_i) {
                      RVar12.m_i = RVar12.m_i + (iVar11 - RVar19.m_i);
                      local_48._0_4_ = RVar12.m_i;
                      QVar7 = _local_48;
                      RStack_3c = QVar6.y2.m_i;
                      local_48 = QVar7._0_8_;
                      RStack_40.m_i = iVar11;
                      RVar19.m_i = iVar11;
                    }
                    if (RVar12.m_i < 0) {
                      RStack_40.m_i = RVar19.m_i - RVar12.m_i;
                      auVar5._12_4_ = 0;
                      auVar5._0_12_ = stack0xffffffffffffffbc;
                      _local_48 = (QRect)(auVar5 << 0x20);
                    }
                    QVar6 = _local_48;
                    if (RVar22.m_i < 0) {
                      RStack_3c.m_i = RVar17.m_i - RVar22.m_i;
                      local_48._0_4_ = QVar6.x1.m_i;
                      local_48._4_4_ = 0;
                    }
                  }
                }
                if ((this->visible == true) && (this->docks[lVar16].o == Horizontal)) {
                  _local_48 = QStyle::visualRect(direction,&this_02->rect,(QRect *)local_48);
                }
                QWidgetAnimator::animate
                          ((QWidgetAnimator *)&pQVar13->widgetAnimator,widget,(QRect *)local_48,
                           animate);
              }
            }
            uVar21 = uVar21 + 1;
            lVar23 = lVar23 + 0x18;
          } while (uVar21 < (ulong)(this_02->toolBarItems).d.size);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < (ulong)this->docks[lVar16].lines.d.size);
    }
    lVar16 = lVar16 + 1;
    if (lVar16 == 4) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

void QToolBarAreaLayout::apply(bool animate)
{
    QMainWindowLayout *layout = qt_mainwindow_layout(mainWindow);
    Q_ASSERT(layout != nullptr);

    Qt::LayoutDirection dir = mainWindow->layoutDirection();

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);
            if (line.skip())
                continue;

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                const QToolBarAreaLayoutItem &item = line.toolBarItems.at(k);
                if (item.skip() || item.gap)
                    continue;

                QRect geo;
                if (visible) {
                    if (line.o == Qt::Horizontal) {
                        geo.setTop(line.rect.top());
                        geo.setBottom(line.rect.bottom());
                        geo.setLeft(line.rect.left() + item.pos);
                        geo.setRight(line.rect.left() + item.pos + item.size - 1);
                    } else {
                        geo.setLeft(line.rect.left());
                        geo.setRight(line.rect.right());
                        geo.setTop(line.rect.top() + item.pos);
                        geo.setBottom(line.rect.top() + item.pos + item.size - 1);
                    }
                }

                QWidget *widget = item.widgetItem->widget();
                if (QToolBar *toolBar = qobject_cast<QToolBar*>(widget)) {
                    QToolBarLayout *tbl = qobject_cast<QToolBarLayout*>(toolBar->layout());
                    if (tbl->expanded) {
                        QPoint tr = geo.topRight();
                        QSize size = tbl->expandedSize(geo.size());
                        geo.setSize(size);
                        geo.moveTopRight(tr);
                        if (geo.bottom() > rect.bottom())
                            geo.moveBottom(rect.bottom());
                        if (geo.right() > rect.right())
                            geo.moveRight(rect.right());
                        if (geo.left() < 0)
                            geo.moveLeft(0);
                        if (geo.top() < 0)
                            geo.moveTop(0);
                    }
                }

                if (visible && dock.o == Qt::Horizontal)
                    geo = QStyle::visualRect(dir, line.rect, geo);

                layout->widgetAnimator.animate(widget, geo, animate);
            }
        }
    }
}